

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  undefined4 uVar1;
  undefined4 uVar2;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_io_methods *psVar6;
  sqlite3_io_methods *psVar7;
  sqlite3_io_methods *psVar8;
  sqlite3_io_methods *psVar9;
  sqlite3_io_methods *psVar10;
  sqlite3_io_methods *psVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  sqlite3_file sVar15;
  sqlite3_io_methods *psVar16;
  int iVar17;
  long lVar18;
  sqlite3_file sVar19;
  int iVar20;
  size_t __n;
  
  iVar14 = *(int *)((long)&pJfd[1].pMethods + 4);
  if ((0 < (long)iVar14) && ((long)iVar14 < iAmt + iOfst)) {
    psVar3 = pJfd->pMethods;
    iVar17 = *(int *)&pJfd[1].pMethods;
    psVar4 = pJfd[2].pMethods;
    psVar5 = pJfd[3].pMethods;
    psVar6 = pJfd[6].pMethods;
    psVar10 = pJfd[4].pMethods;
    psVar11 = pJfd[5].pMethods;
    uVar1 = *(undefined4 *)&pJfd[7].pMethods;
    uVar2 = *(undefined4 *)((long)&pJfd[7].pMethods + 4);
    psVar7 = pJfd[8].pMethods;
    psVar8 = pJfd[9].pMethods;
    pJfd->pMethods = (sqlite3_io_methods *)0x0;
    pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
    iVar13 = (*psVar7->xSync)((sqlite3_file *)psVar7,(int)psVar8);
    if (iVar13 == 0) {
      iVar13 = 0;
      if (psVar4 != (sqlite3_io_methods *)0x0) {
        lVar18 = 0;
        psVar16 = psVar4;
        iVar20 = iVar17;
        do {
          if ((long)psVar5 < iVar20 + lVar18) {
            iVar20 = (int)psVar5 - (int)lVar18;
          }
          iVar13 = (*pJfd->pMethods->xWrite)(pJfd,&psVar16->xClose,iVar20,lVar18);
          if (iVar13 != 0) goto LAB_0014a301;
          lVar18 = lVar18 + iVar20;
          psVar16 = *(sqlite3_io_methods **)psVar16;
        } while (psVar16 != (sqlite3_io_methods *)0x0);
        iVar13 = 0;
      }
LAB_0014a301:
      if ((psVar4 != (sqlite3_io_methods *)0x0) && (psVar16 = psVar4, iVar13 == 0)) {
        do {
          psVar9 = *(sqlite3_io_methods **)psVar16;
          sqlite3_free(psVar16);
          psVar16 = psVar9;
        } while (psVar9 != (sqlite3_io_methods *)0x0);
      }
    }
    if (iVar13 != 0) {
      if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
        (*pJfd->pMethods->xClose)(pJfd);
        pJfd->pMethods = (sqlite3_io_methods *)0x0;
      }
      pJfd->pMethods = psVar3;
      *(int *)&pJfd[1].pMethods = iVar17;
      *(int *)((long)&pJfd[1].pMethods + 4) = iVar14;
      pJfd[2].pMethods = psVar4;
      pJfd[3].pMethods = psVar5;
      pJfd[6].pMethods = psVar6;
      pJfd[4].pMethods = psVar10;
      pJfd[5].pMethods = psVar11;
      *(undefined4 *)&pJfd[7].pMethods = uVar1;
      *(undefined4 *)((long)&pJfd[7].pMethods + 4) = uVar2;
      pJfd[8].pMethods = psVar7;
      pJfd[9].pMethods = psVar8;
      if (iVar13 != 0) {
        return iVar13;
      }
    }
    iVar14 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
    return iVar14;
  }
  if ((0 < iOfst) && (pJfd[3].pMethods != (sqlite3_io_methods *)iOfst)) {
    memjrnlTruncate(pJfd,iOfst);
  }
  if ((iOfst == 0) && (pJfd[2].pMethods != (sqlite3_io_methods *)0x0)) {
    memcpy(&(pJfd[2].pMethods)->xClose,zBuf,(long)iAmt);
LAB_0014a407:
    iVar14 = 0;
  }
  else {
    do {
      if (iAmt < 1) goto LAB_0014a407;
      sVar19.pMethods = pJfd[4].pMethods;
      iVar14 = *(int *)&pJfd[1].pMethods;
      lVar18 = (long)pJfd[3].pMethods % (long)iVar14;
      iVar17 = iVar14 - (int)lVar18;
      if (iAmt < iVar17) {
        iVar17 = iAmt;
      }
      if (lVar18 == 0) {
        sVar15.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar14 + 8);
        if (sVar15.pMethods != (sqlite3_io_methods *)0x0) {
          if (sVar19.pMethods == (sqlite3_io_methods *)0x0) {
            sVar19.pMethods = (sqlite3_io_methods *)(pJfd + 2);
          }
          *(undefined8 *)sVar15.pMethods = 0;
          *(sqlite3_io_methods **)sVar19.pMethods = sVar15.pMethods;
          pJfd[4].pMethods = sVar15.pMethods;
          sVar19.pMethods = sVar15.pMethods;
        }
        if (sVar15.pMethods != (sqlite3_io_methods *)0x0) goto LAB_0014a3b0;
        bVar12 = false;
      }
      else {
LAB_0014a3b0:
        __n = (size_t)iVar17;
        memcpy((void *)((long)&(sVar19.pMethods)->xClose + lVar18),zBuf,__n);
        zBuf = (void *)((long)zBuf + __n);
        iAmt = iAmt - iVar17;
        pJfd[3].pMethods = (sqlite3_io_methods *)((long)&(pJfd[3].pMethods)->iVersion + __n);
        bVar12 = true;
      }
    } while (bVar12);
    iVar14 = 0xc0a;
  }
  return iVar14;
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */
    assert( iOfst<=p->endpoint.iOffset );
    if( iOfst>0 && iOfst!=p->endpoint.iOffset ){
      memjrnlTruncate(pJfd, iOfst);
    }
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else{
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        assert( pChunk!=0 || iChunkOffset==0 );
        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          pChunk = p->endpoint.pChunk = pNew;
        }

        assert( pChunk!=0 );
        memcpy((u8*)pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
    }
  }

  return SQLITE_OK;
}